

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O0

HRESULT __thiscall
Js::SCAPropBag::InternalAddNoCopy(SCAPropBag *this,LPCWSTR name,charcount_t len,Var value)

{
  BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  InternalString local_40;
  charcount_t local_30;
  HRESULT local_2c;
  int intLen;
  HRESULT hr;
  Var value_local;
  LPCWSTR pWStack_18;
  charcount_t len_local;
  LPCWSTR name_local;
  SCAPropBag *this_local;
  
  local_2c = 0;
  _intLen = value;
  value_local._4_4_ = len;
  pWStack_18 = name;
  name_local = (LPCWSTR)this;
  local_2c = UIntToInt(len,(INT *)&local_30);
  if (-1 < local_2c) {
    this_00 = Memory::
              RecyclerRootPtr<JsUtil::BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->(&this->m_properties);
    InternalString::InternalString(&local_40,pWStack_18,local_30,'\0');
    JsUtil::
    BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
    ::Item(this_00,&local_40,(void **)&intLen);
  }
  return local_2c;
}

Assistant:

HRESULT SCAPropBag::InternalAddNoCopy(LPCWSTR name, charcount_t len, Var value)
    {
        HRESULT hr = S_OK;

        int intLen;
        IfFailGo(UIntToInt(len, &intLen));
        m_properties->Item(InternalString(name, intLen), value);

Error:
        return hr;
    }